

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O1

int agent_sign(LIBSSH2_SESSION *session,uchar **sig,size_t *sig_len,uchar *data,size_t data_len,
              void **abstract)

{
  undefined8 *puVar1;
  void *pvVar2;
  long *plVar3;
  bool bVar4;
  int iVar5;
  uint32_t uVar6;
  void *__dest;
  size_t *psVar7;
  uchar *puVar8;
  char *errmsg;
  int errcode;
  ulong uVar9;
  long lVar10;
  uchar *s;
  uchar *local_50;
  size_t *local_48;
  uchar **local_40;
  LIBSSH2_SESSION *local_38;
  
  pvVar2 = *abstract;
  puVar1 = (undefined8 *)((long)pvVar2 + 0x18);
  if (*(int *)((long)pvVar2 + 0x38) == 0) {
    lVar10 = *(long *)((long)pvVar2 + 0x48);
    local_48 = sig_len;
    local_40 = sig;
    local_50 = (uchar *)(*session->alloc)(data_len + *(long *)(lVar10 + 0x30) + 0xd,
                                          &session->abstract);
    *puVar1 = local_50;
    if (local_50 == (uchar *)0x0) {
      iVar5 = _libssh2_error(session,-6,"out of memory");
      return iVar5;
    }
    *local_50 = '\r';
    local_50 = local_50 + 1;
    local_38 = session;
    _libssh2_store_str(&local_50,*(char **)(lVar10 + 0x28),*(size_t *)(lVar10 + 0x30));
    session = local_38;
    _libssh2_store_str(&local_50,(char *)data,data_len);
    sig_len = local_48;
    uVar6 = 0;
    if ((((session->userauth_pblc_method_len != 0) &&
         (plVar3 = (long *)session->userauth_pblc_method, uVar6 = 0, plVar3 != (long *)0x0)) &&
        (uVar6 = 0, session->userauth_pblc_method_len == 0xc)) &&
       (bVar4 = (int)plVar3[1] == 0x3231352d,
       uVar6 = (uint)(bVar4 && *plVar3 == 0x326168732d617372) << 2,
       !bVar4 || *plVar3 != 0x326168732d617372)) {
      uVar6 = (uint)((int)plVar3[1] == 0x3635322d && *plVar3 == 0x326168732d617372) * 2;
    }
    _libssh2_store_u32(&local_50,uVar6);
    *(long *)((long)pvVar2 + 0x20) = (long)local_50 - *(long *)((long)pvVar2 + 0x18);
    *(undefined8 *)((long)pvVar2 + 0x40) = 0;
    *(undefined4 *)((long)pvVar2 + 0x38) = 1;
    sig = local_40;
  }
  if (*(char *)*puVar1 == '\r') {
    if (*(long *)((long)pvVar2 + 0x10) != 0) {
      local_40 = sig;
      iVar5 = (**(code **)(*(long *)((long)pvVar2 + 0x10) + 8))(pvVar2,puVar1);
      if (iVar5 == 0) {
        (*session->free)(*(void **)((long)pvVar2 + 0x18),&session->abstract);
        *(undefined8 *)((long)pvVar2 + 0x18) = 0;
        puVar8 = *(uchar **)((long)pvVar2 + 0x28);
        lVar10 = *(long *)((long)pvVar2 + 0x30);
        iVar5 = -0x2a;
        errcode = -0x2a;
        local_50 = puVar8;
        if (((lVar10 < 1) || (*puVar8 != '\x0e')) ||
           ((local_50 = puVar8 + 1, lVar10 < 5 || (local_50 = puVar8 + 5, lVar10 < 9))))
        goto LAB_0010814b;
        uVar6 = _libssh2_ntohu32(local_50);
        local_50 = local_50 + 4;
        psVar7 = (size_t *)(ulong)uVar6;
        lVar10 = (lVar10 - (long)psVar7) + -9;
        if (lVar10 < 0) goto LAB_0010814b;
        local_48 = psVar7;
        __dest = (*session->alloc)((size_t)psVar7,&session->abstract);
        if (__dest == (void *)0x0) {
          __dest = (void *)0x0;
LAB_001082b5:
          errcode = -6;
        }
        else {
          memcpy(__dest,local_50,(size_t)local_48);
          local_50 = local_50 + (long)local_48;
          psVar7 = (size_t *)
                   plain_method((char *)session->userauth_pblc_method,
                                session->userauth_pblc_method_len);
          if ((((size_t *)session->userauth_pblc_method_len == local_48) || (psVar7 == local_48)) &&
             (iVar5 = bcmp(__dest,session->userauth_pblc_method,(size_t)local_48), iVar5 == 0)) {
            if (3 < lVar10) {
              uVar6 = _libssh2_ntohu32(local_50);
              uVar9 = (ulong)uVar6;
              *sig_len = uVar9;
              local_50 = local_50 + 4;
              if (-1 < (long)((lVar10 - uVar9) + -4)) {
                puVar8 = (uchar *)(*session->alloc)(uVar9,&session->abstract);
                *local_40 = puVar8;
                if (puVar8 == (uchar *)0x0) goto LAB_001082b5;
                memcpy(puVar8,local_50,*sig_len);
                errcode = 0;
              }
            }
          }
          else {
            errcode = -0x33;
          }
        }
      }
      else {
LAB_0010814b:
        errcode = iVar5;
        __dest = (void *)0x0;
      }
      if (__dest != (void *)0x0) {
        (*session->free)(__dest,&session->abstract);
      }
      (*session->free)(*(void **)((long)pvVar2 + 0x18),&session->abstract);
      *(undefined8 *)((long)pvVar2 + 0x18) = 0;
      (*session->free)(*(void **)((long)pvVar2 + 0x28),&session->abstract);
      *(undefined8 *)((long)pvVar2 + 0x28) = 0;
      *(undefined4 *)((long)pvVar2 + 0x38) = 0;
      errmsg = "agent sign failure";
      goto LAB_001081ae;
    }
    errmsg = "agent not connected";
  }
  else {
    errmsg = "illegal request";
  }
  errcode = -0x27;
LAB_001081ae:
  iVar5 = _libssh2_error(session,errcode,errmsg);
  return iVar5;
}

Assistant:

static int
agent_sign(LIBSSH2_SESSION *session, unsigned char **sig, size_t *sig_len,
           const unsigned char *data, size_t data_len, void **abstract)
{
    LIBSSH2_AGENT *agent = (LIBSSH2_AGENT *) (*abstract);
    agent_transaction_ctx_t transctx = &agent->transctx;
    struct agent_publickey *identity = agent->identity;
    ssize_t len = 1 + 4 + identity->external.blob_len + 4 + data_len + 4;
    ssize_t method_len;
    unsigned char *s;
    int rc;
    unsigned char *method_name = NULL;
    uint32_t sign_flags = 0;
    ssize_t plain_len;

    /* Create a request to sign the data */
    if(transctx->state == agent_NB_state_init) {
        s = transctx->request = LIBSSH2_ALLOC(session, len);
        if(!transctx->request)
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "out of memory");

        *s++ = SSH2_AGENTC_SIGN_REQUEST;
        /* key blob */
        _libssh2_store_str(&s, (const char *)identity->external.blob,
                           identity->external.blob_len);
        /* data */
        _libssh2_store_str(&s, (const char *)data, data_len);

        /* flags */
        if(session->userauth_pblc_method_len > 0 &&
            session->userauth_pblc_method) {
            if(session->userauth_pblc_method_len == 12 &&
                !memcmp(session->userauth_pblc_method, "rsa-sha2-512", 12)) {
                sign_flags = SSH_AGENT_RSA_SHA2_512;
            }
            else if(session->userauth_pblc_method_len == 12 &&
                !memcmp(session->userauth_pblc_method, "rsa-sha2-256", 12)) {
                sign_flags = SSH_AGENT_RSA_SHA2_256;
            }
        }
        _libssh2_store_u32(&s, sign_flags);

        transctx->request_len = s - transctx->request;
        transctx->send_recv_total = 0;
        transctx->state = agent_NB_state_request_created;
    }

    /* Make sure to be re-called as a result of EAGAIN. */
    if(*transctx->request != SSH2_AGENTC_SIGN_REQUEST)
        return _libssh2_error(session, LIBSSH2_ERROR_BAD_USE,
                              "illegal request");

    if(!agent->ops)
        /* if no agent has been connected, bail out */
        return _libssh2_error(session, LIBSSH2_ERROR_BAD_USE,
                              "agent not connected");

    rc = agent->ops->transact(agent, transctx);
    if(rc) {
        goto error;
    }
    LIBSSH2_FREE(session, transctx->request);
    transctx->request = NULL;

    len = transctx->response_len;
    s = transctx->response;
    len--;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    if(*s != SSH2_AGENT_SIGN_RESPONSE) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    s++;

    /* Skip the entire length of the signature */
    len -= 4;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    s += 4;

    /* Skip signing method */
    len -= 4;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    method_len = _libssh2_ntohu32(s);
    s += 4;
    len -= method_len;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }

    /* method name */
    method_name = LIBSSH2_ALLOC(session, method_len);
    if(!method_name) {
        rc = LIBSSH2_ERROR_ALLOC;
        goto error;
    }
    memcpy(method_name, s, method_len);
    s += method_len;

    plain_len = plain_method((char *)session->userauth_pblc_method,
                             session->userauth_pblc_method_len);

    /* check to see if we match requested */
    if(((size_t)method_len != session->userauth_pblc_method_len &&
        method_len != plain_len) ||
       memcmp(method_name, session->userauth_pblc_method, method_len)) {
        _libssh2_debug((session,
                       LIBSSH2_TRACE_KEX,
                       "Agent sign method %.*s",
                       method_len, method_name));

        rc = LIBSSH2_ERROR_ALGO_UNSUPPORTED;
        goto error;
    }

    /* Read the signature */
    len -= 4;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    *sig_len = _libssh2_ntohu32(s);
    s += 4;
    len -= *sig_len;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }

    *sig = LIBSSH2_ALLOC(session, *sig_len);
    if(!*sig) {
        rc = LIBSSH2_ERROR_ALLOC;
        goto error;
    }
    memcpy(*sig, s, *sig_len);

error:

    if(method_name)
        LIBSSH2_FREE(session, method_name);

    LIBSSH2_FREE(session, transctx->request);
    transctx->request = NULL;

    LIBSSH2_FREE(session, transctx->response);
    transctx->response = NULL;

    transctx->state = agent_NB_state_init;

    return _libssh2_error(session, rc, "agent sign failure");
}